

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum_fuse.hpp
# Opt level: O3

optional<unsigned_long>
magic_enum::detail::fuse_enum<Color,Directions,Index>(Color head,Directions tail,Index tail_1)

{
  ulong in_RAX;
  ulong uVar1;
  Color *pCVar2;
  optional<unsigned_long> oVar3;
  optional<unsigned_long> oVar4;
  
  if (tail_1 < (two|one)) {
    in_RAX = 0;
    do {
      if (*(Directions *)((long)&values_v<Directions,(magic_enum::detail::enum_subtype)0> + in_RAX)
          == tail) {
        pCVar2 = &values_v<Color,(magic_enum::detail::enum_subtype)0>;
        uVar1 = 0;
        do {
          if (*pCVar2 == head) {
            oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_payload._M_value =
                 in_RAX | uVar1 | (ulong)(tail_1 << 4);
            oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._12_4_ = 0;
            oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._9_3_ = (uint3)((tail_1 << 4) >> 8);
            oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_engaged = true;
            return (optional<unsigned_long>)
                   oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_long>;
          }
          uVar1 = uVar1 + 1;
          pCVar2 = pCVar2 + 1;
        } while (uVar1 != 3);
        break;
      }
      in_RAX = in_RAX + 4;
    } while (in_RAX != 0x10);
  }
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = 0;
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload = (_Storage<unsigned_long,_true>)in_RAX;
  return (optional<unsigned_long>)
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

constexpr optional<std::uintmax_t> fuse_enum(E head, Es... tail) noexcept {
  return fuse_one_enum(fuse_enum(tail...), head);
}